

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mod_inv.c
# Opt level: O1

int32 mod_inv_read_tmat(model_inventory_t *minv,char *fn,float32 floor)

{
  int iVar1;
  int32 iVar2;
  ulong uVar3;
  ulong uVar4;
  uint32 n_state_pm;
  uint32 n_tmat;
  float32 ***tmat;
  uint32 local_2c;
  float local_28;
  uint32 local_24;
  float32 ***local_20;
  
  local_28 = (float)floor;
  iVar1 = s3tmat_read(fn,&local_20,&local_24,&local_2c);
  iVar2 = -1;
  if (iVar1 == 0) {
    if ((local_28 != 0.0) || (NAN(local_28))) {
      err_msg(ERR_INFO,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libmodinv/mod_inv.c"
              ,0x12d,"inserting tprob floor %e and renormalizing\n",(double)local_28);
      if (local_24 != 0) {
        uVar3 = 0;
        do {
          if (local_2c != 1) {
            uVar4 = 0;
            do {
              vector_normalize((vector_t)local_20[uVar3][uVar4],local_2c);
              vector_nz_floor((vector_t)local_20[uVar3][uVar4],local_2c,(float32)local_28);
              vector_normalize((vector_t)local_20[uVar3][uVar4],local_2c);
              uVar4 = uVar4 + 1;
            } while (uVar4 < local_2c - 1);
          }
          uVar3 = uVar3 + 1;
        } while (uVar3 < local_24);
      }
    }
    minv->tmat = local_20;
    minv->n_tmat = local_24;
    minv->n_state_pm = local_2c;
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

int32
mod_inv_read_tmat(model_inventory_t *minv,
		  const char *fn,
		  float32 floor)
{
    float32 ***tmat;
    uint32 n_tmat;
    uint32 n_state_pm;
    uint32 i, j;

    if (s3tmat_read(fn,
		    &tmat,
		    &n_tmat,
		    &n_state_pm) != S3_SUCCESS) {
	return S3_ERROR;
    }

    if (floor != 0) {
	E_INFO("inserting tprob floor %e and renormalizing\n",
	       floor);
    
	for (i = 0; i < n_tmat; i++) {
	    for (j = 0; j < n_state_pm-1; j++) {
		vector_normalize(tmat[i][j], n_state_pm);
		vector_nz_floor(tmat[i][j], n_state_pm, floor);
		vector_normalize(tmat[i][j], n_state_pm);
	    }
	}
    }

    minv->tmat = tmat;
    minv->n_tmat = n_tmat;
    minv->n_state_pm = n_state_pm;

    return S3_SUCCESS;
}